

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser.cpp
# Opt level: O2

vector<std::pair<std::vector<int,_std::allocator<int>_>,_double>,_std::allocator<std::pair<std::vector<int,_std::allocator<int>_>,_double>_>_>
* __thiscall
despot::Parser::ComputeTopTransitions
          (vector<std::pair<std::vector<int,_std::allocator<int>_>,_double>,_std::allocator<std::pair<std::vector<int,_std::allocator<int>_>,_double>_>_>
           *__return_storage_ptr__,Parser *this,vector<int,_std::allocator<int>_> *state,
          ACT_TYPE action,int num)

{
  double dVar1;
  pointer piVar3;
  pointer piVar4;
  pointer pSVar5;
  CPT *pCVar6;
  pointer ppVar7;
  int iVar8;
  uint uVar9;
  undefined4 extraout_var;
  long lVar10;
  long lVar11;
  ulong uVar12;
  ulong uVar13;
  int *piVar14;
  long lVar15;
  double *pdVar16;
  ulong uVar17;
  ulong __new_size;
  uint uVar18;
  pointer ppVar19;
  pointer extraout_XMM0_Qa;
  double dVar20;
  vector<std::pair<std::vector<int,_std::allocator<int>_>,_double>,_std::allocator<std::pair<std::vector<int,_std::allocator<int>_>,_double>_>_>
  tmp;
  vector<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_> distribution;
  pair<std::vector<int,_std::allocator<int>_>,_double> next;
  vector<int,_std::allocator<int>_> state_1;
  double dVar2;
  
  piVar3 = (state->super__Vector_base<int,_std::allocator<int>_>)._M_impl.super__Vector_impl_data.
           _M_start;
  piVar4 = (state->super__Vector_base<int,_std::allocator<int>_>)._M_impl.super__Vector_impl_data.
           _M_finish;
  piVar14 = &(((this->prev_state_vars_).
               super__Vector_base<despot::StateVar,_std::allocator<despot::StateVar>_>._M_impl.
               super__Vector_impl_data._M_start)->super_NamedVar).super_Variable.curr_value;
  for (lVar15 = 0; (long)piVar4 - (long)piVar3 >> 2 != lVar15; lVar15 = lVar15 + 1) {
    *piVar14 = piVar3[lVar15];
    piVar14 = piVar14 + 0x30;
  }
  (((this->action_vars_).super__Vector_base<despot::NamedVar,_std::allocator<despot::NamedVar>_>.
    _M_impl.super__Vector_impl_data._M_start)->super_Variable).curr_value = action;
  (__return_storage_ptr__->
  super__Vector_base<std::pair<std::vector<int,_std::allocator<int>_>,_double>,_std::allocator<std::pair<std::vector<int,_std::allocator<int>_>,_double>_>_>
  )._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  next.first.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  (__return_storage_ptr__->
  super__Vector_base<std::pair<std::vector<int,_std::allocator<int>_>,_double>,_std::allocator<std::pair<std::vector<int,_std::allocator<int>_>,_double>_>_>
  )._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (__return_storage_ptr__->
  super__Vector_base<std::pair<std::vector<int,_std::allocator<int>_>,_double>,_std::allocator<std::pair<std::vector<int,_std::allocator<int>_>,_double>_>_>
  )._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  distribution.super__Vector_base<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>.
  _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  next.first.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_start
       = (pointer)0x0;
  next.first.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_finish
       = (pointer)0x0;
  distribution.super__Vector_base<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>.
  _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  distribution.super__Vector_base<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>.
  _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  next.second = 1.0;
  std::
  vector<std::pair<std::vector<int,std::allocator<int>>,double>,std::allocator<std::pair<std::vector<int,std::allocator<int>>,double>>>
  ::emplace_back<std::pair<std::vector<int,std::allocator<int>>,double>>
            ((vector<std::pair<std::vector<int,std::allocator<int>>,double>,std::allocator<std::pair<std::vector<int,std::allocator<int>>,double>>>
              *)__return_storage_ptr__,&next);
  std::_Vector_base<int,_std::allocator<int>_>::~_Vector_base
            ((_Vector_base<int,_std::allocator<int>_> *)&next);
  std::_Vector_base<int,_std::allocator<int>_>::~_Vector_base
            ((_Vector_base<int,_std::allocator<int>_> *)&distribution);
  __new_size = (ulong)num;
  uVar13 = 0;
  do {
    if ((ulong)((long)(state->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
                      super__Vector_impl_data._M_finish -
                (long)(state->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
                      super__Vector_impl_data._M_start >> 2) <= uVar13) {
      return __return_storage_ptr__;
    }
    distribution.
    super__Vector_base<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    distribution.
    super__Vector_base<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>._M_impl.
    super__Vector_impl_data._M_start = (pointer)0x0;
    distribution.
    super__Vector_base<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>._M_impl.
    super__Vector_impl_data._M_finish = (pointer)0x0;
    iVar8 = (*((this->transition_funcs_).
               super__Vector_base<despot::CPT_*,_std::allocator<despot::CPT_*>_>._M_impl.
               super__Vector_impl_data._M_start[uVar13]->super_Function)._vptr_Function[6])();
    uVar9 = Variable::ComputeCurrentIndex
                      ((vector<despot::NamedVar_*,_std::allocator<despot::NamedVar_*>_> *)
                       CONCAT44(extraout_var,iVar8));
    for (uVar18 = 0;
        pSVar5 = (this->prev_state_vars_).
                 super__Vector_base<despot::StateVar,_std::allocator<despot::StateVar>_>._M_impl.
                 super__Vector_impl_data._M_start,
        (int)uVar18 <
        (int)((ulong)((long)pSVar5[uVar13].super_NamedVar.super_Variable.values_.
                            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                            ._M_impl.super__Vector_impl_data._M_finish -
                     *(long *)&pSVar5[uVar13].super_NamedVar.super_Variable.values_.
                               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                               ._M_impl.super__Vector_impl_data) >> 5); uVar18 = uVar18 + 1) {
      pCVar6 = (this->transition_funcs_).
               super__Vector_base<despot::CPT_*,_std::allocator<despot::CPT_*>_>._M_impl.
               super__Vector_impl_data._M_start[uVar13];
      (*(pCVar6->super_Function)._vptr_Function[4])(pCVar6,(ulong)uVar9,(ulong)uVar18);
      if (0.0 < (double)extraout_XMM0_Qa) {
        next.first.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
        _M_start = (pointer)CONCAT44(next.first.super__Vector_base<int,_std::allocator<int>_>.
                                     _M_impl.super__Vector_impl_data._M_start._4_4_,uVar18);
        next.first.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
        _M_finish = extraout_XMM0_Qa;
        std::vector<std::pair<int,double>,std::allocator<std::pair<int,double>>>::
        emplace_back<std::pair<int,double>>
                  ((vector<std::pair<int,double>,std::allocator<std::pair<int,double>>> *)
                   &distribution,(pair<int,_double> *)&next);
      }
    }
    tmp.
    super__Vector_base<std::pair<std::vector<int,_std::allocator<int>_>,_double>,_std::allocator<std::pair<std::vector<int,_std::allocator<int>_>,_double>_>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    tmp.
    super__Vector_base<std::pair<std::vector<int,_std::allocator<int>_>,_double>,_std::allocator<std::pair<std::vector<int,_std::allocator<int>_>,_double>_>_>
    ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    tmp.
    super__Vector_base<std::pair<std::vector<int,_std::allocator<int>_>,_double>,_std::allocator<std::pair<std::vector<int,_std::allocator<int>_>,_double>_>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    for (uVar12 = 0;
        ppVar19 = (__return_storage_ptr__->
                  super__Vector_base<std::pair<std::vector<int,_std::allocator<int>_>,_double>,_std::allocator<std::pair<std::vector<int,_std::allocator<int>_>,_double>_>_>
                  )._M_impl.super__Vector_impl_data._M_start,
        uVar12 < (ulong)((long)(__return_storage_ptr__->
                               super__Vector_base<std::pair<std::vector<int,_std::allocator<int>_>,_double>,_std::allocator<std::pair<std::vector<int,_std::allocator<int>_>,_double>_>_>
                               )._M_impl.super__Vector_impl_data._M_finish - (long)ppVar19 >> 5);
        uVar12 = uVar12 + 1) {
      ppVar19 = ppVar19 + uVar12;
      for (uVar17 = 0;
          ppVar7 = distribution.
                   super__Vector_base<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>
                   ._M_impl.super__Vector_impl_data._M_start,
          uVar17 < (ulong)((long)distribution.
                                 super__Vector_base<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>
                                 ._M_impl.super__Vector_impl_data._M_finish -
                           (long)distribution.
                                 super__Vector_base<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>
                                 ._M_impl.super__Vector_impl_data._M_start >> 4);
          uVar17 = uVar17 + 1) {
        dVar20 = ppVar19->second *
                 distribution.
                 super__Vector_base<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>
                 ._M_impl.super__Vector_impl_data._M_start[uVar17].second;
        if (((long)tmp.
                   super__Vector_base<std::pair<std::vector<int,_std::allocator<int>_>,_double>,_std::allocator<std::pair<std::vector<int,_std::allocator<int>_>,_double>_>_>
                   ._M_impl.super__Vector_impl_data._M_finish -
             (long)tmp.
                   super__Vector_base<std::pair<std::vector<int,_std::allocator<int>_>,_double>,_std::allocator<std::pair<std::vector<int,_std::allocator<int>_>,_double>_>_>
                   ._M_impl.super__Vector_impl_data._M_start >> 5 != __new_size) ||
           (tmp.
            super__Vector_base<std::pair<std::vector<int,_std::allocator<int>_>,_double>,_std::allocator<std::pair<std::vector<int,_std::allocator<int>_>,_double>_>_>
            ._M_impl.super__Vector_impl_data._M_finish[-1].second <= dVar20)) {
          std::vector<int,_std::allocator<int>_>::vector
                    ((vector<int,_std::allocator<int>_> *)
                     &state_1.super__Vector_base<int,_std::allocator<int>_>,&ppVar19->first);
          std::vector<int,_std::allocator<int>_>::push_back
                    ((vector<int,_std::allocator<int>_> *)
                     &state_1.super__Vector_base<int,_std::allocator<int>_>,&ppVar7[uVar17].first);
          std::vector<int,_std::allocator<int>_>::vector
                    (&next.first,
                     (vector<int,_std::allocator<int>_> *)
                     &state_1.super__Vector_base<int,_std::allocator<int>_>);
          lVar10 = (long)tmp.
                         super__Vector_base<std::pair<std::vector<int,_std::allocator<int>_>,_double>,_std::allocator<std::pair<std::vector<int,_std::allocator<int>_>,_double>_>_>
                         ._M_impl.super__Vector_impl_data._M_finish -
                   (long)tmp.
                         super__Vector_base<std::pair<std::vector<int,_std::allocator<int>_>,_double>,_std::allocator<std::pair<std::vector<int,_std::allocator<int>_>,_double>_>_>
                         ._M_impl.super__Vector_impl_data._M_start >> 5;
          pdVar16 = &(tmp.
                      super__Vector_base<std::pair<std::vector<int,_std::allocator<int>_>,_double>,_std::allocator<std::pair<std::vector<int,_std::allocator<int>_>,_double>_>_>
                      ._M_impl.super__Vector_impl_data._M_start)->second;
          lVar15 = -1;
          do {
            lVar11 = lVar10;
            if (lVar15 - lVar10 == -1) break;
            lVar11 = lVar15 + 1;
            dVar1 = *pdVar16;
            dVar2 = *pdVar16;
            pdVar16 = pdVar16 + 4;
            lVar15 = lVar11;
          } while (dVar20 < dVar2 || dVar20 == dVar1);
          next.second = dVar20;
          std::
          vector<std::pair<std::vector<int,_std::allocator<int>_>,_double>,_std::allocator<std::pair<std::vector<int,_std::allocator<int>_>,_double>_>_>
          ::insert(&tmp,tmp.
                        super__Vector_base<std::pair<std::vector<int,_std::allocator<int>_>,_double>,_std::allocator<std::pair<std::vector<int,_std::allocator<int>_>,_double>_>_>
                        ._M_impl.super__Vector_impl_data._M_start + lVar11,&next);
          if ((num != -1) &&
             (__new_size <
              (ulong)((long)tmp.
                            super__Vector_base<std::pair<std::vector<int,_std::allocator<int>_>,_double>,_std::allocator<std::pair<std::vector<int,_std::allocator<int>_>,_double>_>_>
                            ._M_impl.super__Vector_impl_data._M_finish -
                      (long)tmp.
                            super__Vector_base<std::pair<std::vector<int,_std::allocator<int>_>,_double>,_std::allocator<std::pair<std::vector<int,_std::allocator<int>_>,_double>_>_>
                            ._M_impl.super__Vector_impl_data._M_start >> 5))) {
            std::
            vector<std::pair<std::vector<int,_std::allocator<int>_>,_double>,_std::allocator<std::pair<std::vector<int,_std::allocator<int>_>,_double>_>_>
            ::resize(&tmp,__new_size);
          }
          std::_Vector_base<int,_std::allocator<int>_>::~_Vector_base
                    ((_Vector_base<int,_std::allocator<int>_> *)&next);
          std::_Vector_base<int,_std::allocator<int>_>::~_Vector_base
                    (&state_1.super__Vector_base<int,_std::allocator<int>_>);
        }
      }
    }
    std::
    vector<std::pair<std::vector<int,_std::allocator<int>_>,_double>,_std::allocator<std::pair<std::vector<int,_std::allocator<int>_>,_double>_>_>
    ::operator=(__return_storage_ptr__,&tmp);
    std::
    vector<std::pair<std::vector<int,_std::allocator<int>_>,_double>,_std::allocator<std::pair<std::vector<int,_std::allocator<int>_>,_double>_>_>
    ::~vector(&tmp);
    std::_Vector_base<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>::
    ~_Vector_base(&distribution.
                   super__Vector_base<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>
                 );
    uVar13 = uVar13 + 1;
  } while( true );
}

Assistant:

vector<pair<vector<int>, double> > Parser::ComputeTopTransitions(
	const vector<int>& state, ACT_TYPE action, int num) const {
	for (int s = 0; s < state.size(); s++) {
		prev_state_vars_[s].curr_value = state[s];
	}
	action_vars_[0].curr_value = action;

	vector<pair<vector<int>, double> > best;
	best.push_back(pair<vector<int>, double>(vector<int>(), 1.0));
	for (int s = 0; s < state.size(); s++) {
		// Compute sparse next state distribution
		vector<pair<int, double> > distribution;
		int pid = Variable::ComputeCurrentIndex(
			transition_funcs_[s]->parents());
		for (int v = 0; v < prev_state_vars_[s].Size(); v++) {
			double prob = transition_funcs_[s]->GetValue(pid, v);
			if (prob > 0)
				distribution.push_back(pair<int, double>(v, prob));
		}

		// Extend current best state vectors and keep the best
		vector<pair<vector<int>, double> > tmp;
		for (int i = 0; i < best.size(); i++) {
			const pair<vector<int>, double>& it1 = best[i];
			for (int j = 0; j < distribution.size(); j++) {
				const pair<int, double>& it2 = distribution[j];

				// Extend
				double prob = it1.second * it2.second;

				if (tmp.size() == num && prob < tmp.back().second)
					continue;

				vector<int> state = it1.first;
				state.push_back(it2.first);
				pair<vector<int>, double> next(state, prob);

				// Insert in descending order
				int k = 0;
				for (; k < tmp.size(); k++) {
					if (tmp[k].second < next.second)
						break;
				}
				tmp.insert(tmp.begin() + k, next);

				// Keep the best
				if (num != -1 && tmp.size() > num)
					tmp.resize(num);
			}
		}

		best = tmp;
	}
	return best;
}